

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclShortFormula(SC_Cell *pCell,char *pForm,char *pBuffer)

{
  int iVar1;
  char *pLimit_00;
  undefined8 *puVar2;
  char *pLimit;
  char *pTemp;
  int i;
  SC_Pin *pPin;
  char *pBuffer_local;
  char *pForm_local;
  SC_Cell *pCell_local;
  
  pLimit = pForm;
  pPin = (SC_Pin *)pBuffer;
  do {
    while( true ) {
      if (*pLimit == '\0') {
        *(undefined1 *)&pPin->pName = 0;
        return;
      }
      iVar1 = Abc_SclIsChar(*pLimit);
      if (iVar1 != 0) break;
      *(char *)&pPin->pName = *pLimit;
      pLimit = pLimit + 1;
      pPin = (SC_Pin *)((long)&pPin->pName + 1);
    }
    pLimit_00 = Abc_SclFindLimit(pLimit);
    for (pTemp._4_4_ = 0; pTemp._4_4_ < pCell->n_inputs; pTemp._4_4_ = pTemp._4_4_ + 1) {
      puVar2 = (undefined8 *)Vec_PtrEntry(&pCell->vPins,pTemp._4_4_);
      iVar1 = Abc_SclAreEqual((char *)*puVar2,pLimit,pLimit_00);
      if (iVar1 != 0) {
        *(char *)&pPin->pName = (char)pTemp._4_4_ + 'a';
        pPin = (SC_Pin *)((long)&pPin->pName + 1);
        break;
      }
    }
    pLimit = pLimit_00;
    if (pCell->n_inputs <= pTemp._4_4_) {
      __assert_fail("i < pCell->n_inputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLibUtil.c"
                    ,0x96,"void Abc_SclShortFormula(SC_Cell *, char *, char *)");
    }
  } while( true );
}

Assistant:

void Abc_SclShortFormula( SC_Cell * pCell, char * pForm, char * pBuffer )
{
    SC_Pin * pPin; int i;
    char * pTemp, * pLimit;
    for ( pTemp = pForm; *pTemp; )
    {
        if ( !Abc_SclIsChar(*pTemp) )
        {
            *pBuffer++ = *pTemp++;
            continue;
        }
        pLimit = Abc_SclFindLimit( pTemp );
        SC_CellForEachPinIn( pCell, pPin, i )
            if ( Abc_SclAreEqual( pPin->pName, pTemp, pLimit ) )
            {
                *pBuffer++ = 'a' + i;
                break;
            }
        assert( i < pCell->n_inputs );
        pTemp = pLimit;
    }
    *pBuffer++ = 0;
}